

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_AddPegoutTxOut_Test::TestBody
          (ConfidentialTransactionContext_AddPegoutTxOut_Test *this)

{
  byte bVar1;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  char *pcVar2;
  char *pcVar3;
  undefined1 local_560 [34];
  allocator local_53e;
  allocator local_53d;
  allocator local_53c;
  allocator local_53b;
  allocator local_53a;
  allocator local_539;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  vector local_4f0 [32];
  undefined1 local_4d0 [32];
  undefined1 local_4b0 [48];
  string local_480 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_460;
  string local_448 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_428;
  undefined1 local_408 [24];
  Address pegout_addr;
  string local_278 [32];
  ConfidentialTransactionContext txc;
  Address addr;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  cfd::core::Address::Address(&addr);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)local_560);
  cfd::core::Txid::Txid((Txid *)&pegout_addr,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxIn
            ((Txid *)&txc,(uint)&pegout_addr,0,(Script *)0xfffffffffffffffd);
  cfd::core::Txid::~Txid((Txid *)&pegout_addr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)local_560,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",
             (allocator *)(local_4b0 + 0x10));
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&pegout_addr,(string *)local_560,local_4f0);
  local_4d0._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_4d0[8] = extraout_DL;
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&local_428);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&gtest_ar_2);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)&txc,(Amount *)&pegout_addr,(ConfidentialAssetId *)local_4d0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  cfd::core::Address::~Address(&pegout_addr);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_4f0);
  std::__cxx11::string::~string((string *)local_560);
  local_4b0._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_4b0[8] = extraout_DL_00;
  std::__cxx11::string::string
            ((string *)local_560,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             &local_539);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)local_560);
  std::__cxx11::string::string
            ((string *)local_4f0,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
             &local_53a);
  cfd::core::BlockHash::BlockHash((BlockHash *)&gtest_ar_2,(string *)local_4f0);
  std::__cxx11::string::string((string *)local_4d0,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",&local_53b)
  ;
  cfd::core::Address::Address(&pegout_addr,(string *)local_4d0);
  std::__cxx11::string::string
            ((string *)(local_4b0 + 0x10),
             "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",&local_53c);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_408,(string *)(local_4b0 + 0x10));
  std::__cxx11::string::string
            (local_448,"cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",&local_53d);
  cfd::core::Privkey::FromWif((string *)&local_428,(NetType)local_448,true);
  std::__cxx11::string::string
            (local_278,
             "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
             ,&local_53e);
  std::__cxx11::string::string
            (local_480,
             "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
             ,(allocator *)(local_560 + 0x21));
  cfd::core::ByteData::ByteData((ByteData *)&local_460,local_480);
  pcVar3 = (char *)0x2;
  cfd::ConfidentialTransactionContext::AddPegoutTxOut
            ((Amount *)&txc,(ConfidentialAssetId *)local_4b0,(BlockHash *)&gtest_ar,
             (Address *)&gtest_ar_2,(NetType)&pegout_addr,(Pubkey *)0x2,(Privkey *)local_408,
             (string *)&local_428,(uint)local_278,(ByteData *)0x0,(NetType)&local_460,(Address *)0x4
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_460);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_278);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_428);
  std::__cxx11::string::~string(local_448);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_408);
  std::__cxx11::string::~string((string *)(local_4b0 + 0x10));
  cfd::core::Address::~Address(&pegout_addr);
  std::__cxx11::string::~string((string *)local_4d0);
  cfd::core::BlockHash::~BlockHash((BlockHash *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)local_4f0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_560);
  local_560._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_560[8] = extraout_DL_01;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&gtest_ar_2);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&pegout_addr,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)&txc,(ConfidentialAssetId *)local_560);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&pegout_addr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,_pegout_addr,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string((string *)&pegout_addr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pegout_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_560,(Message *)&pegout_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_560);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pegout_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"addr.GetAddress().c_str()",
             "\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",_pegout_addr,
             "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
  std::__cxx11::string::~string((string *)&pegout_addr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pegout_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_560,(Message *)&pegout_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_560);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pegout_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = cfd::ConfidentialTransactionContext::HasPegoutTxOut((uint)&txc);
  gtest_ar.success_ = (bool)(bVar1 ^ 1);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)local_560);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&pegout_addr,(internal *)&gtest_ar,
               (AssertionResult *)"txc.HasPegoutTxOut(0)","true","false",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x144,_pegout_addr);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    std::__cxx11::string::~string((string *)&pegout_addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_560);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = (bool)cfd::ConfidentialTransactionContext::HasPegoutTxOut((uint)&txc);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_560);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&pegout_addr,(internal *)&gtest_ar,
               (AssertionResult *)"txc.HasPegoutTxOut(1)","false","true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x145,_pegout_addr);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    std::__cxx11::string::~string((string *)&pegout_addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_560);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::ConfidentialTransactionContext::GetTxOutPegoutAddress((uint)&pegout_addr,(NetType)&txc);
  cfd::core::Address::GetAddress_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"pegout_addr.GetAddress()","addr.GetAddress()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560);
  std::__cxx11::string::~string((string *)local_560);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x147,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_560,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_560);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::Address::~Address(&pegout_addr);
  cfd::core::Address::~Address(&addr);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPegoutTxOut)
{
    ConfidentialTransactionContext txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");

    EXPECT_FALSE(txc.HasPegoutTxOut(0));
    EXPECT_TRUE(txc.HasPegoutTxOut(1));
    auto pegout_addr = txc.GetTxOutPegoutAddress(1, NetType::kRegtest);
    EXPECT_EQ(pegout_addr.GetAddress(), addr.GetAddress());
}